

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_set_lineorder(exr_context_t ctxt,int part_index,char *name,exr_lineorder_t lval)

{
  exr_result_t eVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  if (lval < EXR_LINEORDER_LAST_TYPE) {
    if ((name != (char *)0x0) && (iVar2 = strcmp(name,"lineOrder"), iVar2 == 0)) {
      eVar1 = exr_set_lineorder(ctxt,part_index,lval);
      return eVar1;
    }
    local_38 = (exr_attribute_t *)0x0;
    if (ctxt != (exr_context_t)0x0) {
      if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
        eVar1 = (**(code **)(ctxt + 0x48))
                          (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48))
        ;
        return eVar1;
      }
      if (*ctxt == (_priv_exr_context_t)0x3) {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
        uVar3 = 0x15;
      }
      else {
        if (*ctxt != (_priv_exr_context_t)0x0) {
          list = (exr_attribute_list_t *)
                 (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
          eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
          if (eVar1 == 0) {
            if (local_38->type != EXR_ATTR_LINEORDER) {
              eVar1 = (**(code **)(ctxt + 0x48))
                                (ctxt,0x10,
                                 "\'%s\' requested type \'uc\', but stored attributes is type \'%s\'"
                                 ,name,local_38->type_name);
              return eVar1;
            }
          }
          else {
            if (eVar1 != 0xf) {
              return eVar1;
            }
            if (*ctxt != (_priv_exr_context_t)0x1) {
              return 0xf;
            }
            eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&local_38)
            ;
            if (eVar1 != 0) {
              return eVar1;
            }
          }
          (local_38->field_6).uc = (uint8_t)lval;
          return 0;
        }
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
        uVar3 = 8;
      }
      eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar3);
      return eVar1;
    }
    eVar1 = 2;
  }
  else {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"\'%s\' value for line order enum (%d) out of range (%d - %d)",name,
                       lval,0,3);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_lineorder (
    exr_context_t ctxt, int part_index, const char* name, exr_lineorder_t lval)
{
    uint8_t val = (uint8_t) lval;
    if (lval >= EXR_LINEORDER_LAST_TYPE)
        return EXR_CTXT (ctxt)->print_error (
            EXR_CTXT (ctxt),
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'%s' value for line order enum (%d) out of range (%d - %d)",
            name,
            (int) lval,
            0,
            (int) EXR_LINEORDER_LAST_TYPE);

    if (name && 0 == strcmp (name, EXR_REQ_LO_STR))
        return exr_set_lineorder (ctxt, part_index, lval);

    ATTR_SET_IMPL (EXR_ATTR_LINEORDER, uc);
}